

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_reference_block
          (CompilerGLSL *this,uint32_t type_id,bool forward_declaration)

{
  __node_base_ptr *t;
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint32_t uVar4;
  ulong uVar5;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  ts_1;
  mapped_type *this_00;
  pointer ppVar6;
  SPIRType *type_00;
  undefined8 uVar7;
  TypedID<(spirv_cross::Types)0> *ts_1_00;
  string *name;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar8;
  bool local_5e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  SPIRType *local_580;
  SPIRType *pointee_type;
  string local_570 [32];
  TypedID *local_550;
  TypedID<(spirv_cross::Types)1> *member;
  TypedID<(spirv_cross::Types)1> *__end3;
  TypedID<(spirv_cross::Types)1> *__begin3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range3;
  undefined1 local_528 [4];
  uint32_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  uint32_t local_4e4;
  TypedID<(spirv_cross::Types)1> local_4e0;
  TypedID<(spirv_cross::Types)0> local_4dc;
  undefined1 local_4d8 [8];
  SPIRType wrap_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [8];
  string packing_standard;
  undefined1 local_308 [8];
  string decorations;
  Bitset flags;
  string local_288;
  allocator local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attributes;
  uint local_11c;
  _Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false>
  _Stack_118;
  uint32_t alignment;
  iterator itr;
  string local_d0;
  string local_b0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_90;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_88;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_80;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_78;
  string local_70 [48];
  undefined1 local_40 [8];
  string buffer_name;
  SPIRType *type;
  bool forward_declaration_local;
  CompilerGLSL *pCStack_10;
  uint32_t type_id_local;
  CompilerGLSL *this_local;
  
  type._3_1_ = forward_declaration;
  type._4_4_ = type_id;
  pCStack_10 = this;
  buffer_name.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type_id);
  ::std::__cxx11::string::string((string *)local_40);
  if (((type._3_1_ & 1) == 0) ||
     (bVar2 = Compiler::is_physical_pointer_to_buffer_block
                        (&this->super_Compiler,(SPIRType *)buffer_name.field_2._8_8_), !bVar2)) {
    ts_1._M_cur = (__node_type *)0x0;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&itr,this,buffer_name.field_2._8_8_);
    ::std::__cxx11::string::operator=((string *)local_40,(string *)&itr);
    ::std::__cxx11::string::~string((string *)&itr);
  }
  else {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)(buffer_name.field_2._8_8_ + 8));
    uVar7 = 0;
    (*(this->super_Compiler)._vptr_Compiler[6])(local_70,this,(ulong)uVar4,0);
    ::std::__cxx11::string::operator=((string *)local_40,local_70);
    ::std::__cxx11::string::~string(local_70);
    ::std::
    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
    ::operator[](&(this->super_Compiler).ir.meta,(key_type *)(buffer_name.field_2._8_8_ + 8));
    bVar3 = ::std::__cxx11::string::empty();
    ts_1_00 = (TypedID<(spirv_cross::Types)0> *)CONCAT71((int7)((ulong)uVar7 >> 8),bVar3);
    local_5e1 = true;
    if ((bVar3 & 1) == 0) {
      local_78._M_cur =
           (__node_type *)
           ::std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&this->block_ssbo_names,(key_type *)local_40);
      local_80._M_cur =
           (__node_type *)
           ::std::
           end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                     (&this->block_ssbo_names);
      bVar2 = ::std::__detail::operator!=(&local_78,&local_80);
      ts_1_00 = (TypedID<(spirv_cross::Types)0> *)CONCAT71((int7)((ulong)ts_1_00 >> 8),bVar2);
      local_5e1 = true;
      if (!bVar2) {
        local_88._M_cur =
             (__node_type *)
             ::std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->resource_names,(key_type *)local_40);
        local_90._M_cur =
             (__node_type *)
             ::std::
             end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                       (&this->resource_names);
        local_5e1 = ::std::__detail::operator!=(&local_88,&local_90);
      }
    }
    if (local_5e1 != false) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                (&local_b0,(spirv_cross *)0x66305e,(char (*) [2])(buffer_name.field_2._8_8_ + 8),
                 ts_1_00);
      ::std::__cxx11::string::operator=((string *)local_40,(string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
    }
    name = (string *)local_40;
    add_variable(this,&this->block_ssbo_names,&this->resource_names,name);
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                (&local_d0,(spirv_cross *)0x66305e,(char (*) [2])(buffer_name.field_2._8_8_ + 8),
                 (TypedID<(spirv_cross::Types)0> *)name);
      ::std::__cxx11::string::operator=((string *)local_40,(string *)&local_d0);
      ::std::__cxx11::string::~string((string *)&local_d0);
    }
    ::std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->block_names,(value_type *)local_40);
    pVar8 = ::std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->block_ssbo_names,(value_type *)local_40);
    ts_1._M_cur = (__node_type *)
                  pVar8.first.
                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ._M_cur;
    this_00 = ::std::
              unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
              ::operator[](&(this->super_Compiler).ir.meta,
                           (key_type *)(buffer_name.field_2._8_8_ + 8));
    ::std::__cxx11::string::operator=((string *)this_00,(string *)local_40);
  }
  if ((type._3_1_ & 1) == 0) {
    _Stack_118._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>_>
         ::find(&(this->super_Compiler).physical_storage_type_to_alignment,
                (key_type *)((long)&type + 4));
    local_11c = 0;
    attributes.stack_storage.aligned_char._248_8_ =
         ::std::
         unordered_map<unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>_>
         ::end(&(this->super_Compiler).physical_storage_type_to_alignment);
    bVar2 = ::std::__detail::operator!=
                      (&stack0xfffffffffffffee8,
                       (_Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false>
                        *)(attributes.stack_storage.aligned_char + 0xf8));
    if (bVar2) {
      ppVar6 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false,_false>
                             *)&stack0xfffffffffffffee8);
      local_11c = (ppVar6->second).alignment;
    }
    bVar2 = Compiler::is_physical_pointer_to_buffer_block
                      (&this->super_Compiler,(SPIRType *)buffer_name.field_2._8_8_);
    if (bVar2) {
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_240);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_260,"buffer_reference",&local_261);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_240,&local_260);
      ::std::__cxx11::string::~string((string *)&local_260);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_261);
      if (local_11c != 0) {
        join<char_const(&)[26],unsigned_int&>
                  (&local_288,(spirv_cross *)0x67ab8b,(char (*) [26])&local_11c,(uint *)ts_1._M_cur)
        ;
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_240,&local_288);
        ::std::__cxx11::string::~string((string *)&local_288);
      }
      buffer_to_packing_standard_abi_cxx11_
                ((string *)&flags.higher._M_h._M_single_bucket,this,
                 (SPIRType *)buffer_name.field_2._8_8_,true,true);
      t = &flags.higher._M_h._M_single_bucket;
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_240,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t);
      ::std::__cxx11::string::~string((string *)t);
      ParsedIR::get_buffer_block_type_flags
                ((Bitset *)((long)&decorations.field_2 + 8),&(this->super_Compiler).ir,
                 (SPIRType *)buffer_name.field_2._8_8_);
      ::std::__cxx11::string::string((string *)local_308);
      bVar2 = Bitset::get((Bitset *)((long)&decorations.field_2 + 8),0x13);
      if (bVar2) {
        ::std::__cxx11::string::operator+=((string *)local_308," restrict");
      }
      bVar2 = Bitset::get((Bitset *)((long)&decorations.field_2 + 8),0x17);
      if (bVar2) {
        ::std::__cxx11::string::operator+=((string *)local_308," coherent");
      }
      bVar2 = Bitset::get((Bitset *)((long)&decorations.field_2 + 8),0x19);
      if (bVar2) {
        ::std::__cxx11::string::operator+=((string *)local_308," writeonly");
      }
      bVar2 = Bitset::get((Bitset *)((long)&decorations.field_2 + 8),0x18);
      if (bVar2) {
        ::std::__cxx11::string::operator+=((string *)local_308," readonly");
      }
      merge((string *)((long)&packing_standard.field_2 + 8),
            (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
             *)local_240,", ");
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&>
                (this,(char (*) [8])"layout(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&packing_standard.field_2 + 8),(char (*) [2])0x682405,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                 (char (*) [9])0x67abbd,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      ::std::__cxx11::string::~string((string *)(packing_standard.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)local_308);
      Bitset::~Bitset((Bitset *)((long)&decorations.field_2 + 8));
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_240);
    }
    else {
      ::std::__cxx11::string::string((string *)local_348);
      if (*(int *)(buffer_name.field_2._8_8_ + 0x10) == 0xf) {
        buffer_to_packing_standard_abi_cxx11_
                  ((string *)&wrap_type.member_name_cache._M_h._M_single_bucket,this,
                   (SPIRType *)buffer_name.field_2._8_8_,true,false);
        ::std::operator+(&local_368,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &wrap_type.member_name_cache._M_h._M_single_bucket,", ");
        ::std::__cxx11::string::operator=((string *)local_348,(string *)&local_368);
        ::std::__cxx11::string::~string((string *)&local_368);
        ::std::__cxx11::string::~string
                  ((string *)&wrap_type.member_name_cache._M_h._M_single_bucket);
      }
      else {
        type_00 = Compiler::get_pointee_type
                            (&this->super_Compiler,(SPIRType *)buffer_name.field_2._8_8_);
        bVar2 = Compiler::is_array(&this->super_Compiler,type_00);
        if (bVar2) {
          SPIRType::SPIRType((SPIRType *)local_4d8,OpTypeStruct);
          uVar4 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_4dc,uVar4);
          wrap_type.super_IVariant._vptr_IVariant._0_4_ = local_4dc.id;
          uVar4 = Compiler::get_pointee_type_id(&this->super_Compiler,type._4_4_);
          TypedID<(spirv_cross::Types)1>::TypedID(&local_4e0,uVar4);
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                    ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                     &wrap_type.storage,&local_4e0);
          local_4e4 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&wrap_type);
          ParsedIR::set_member_decoration
                    (&(this->super_Compiler).ir,(TypeID)local_4e4,0,DecorationOffset,0);
          buffer_to_packing_standard_abi_cxx11_
                    ((string *)local_528,this,(SPIRType *)local_4d8,true,false);
          ::std::operator+(&local_508,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_528,", ");
          ::std::__cxx11::string::operator=((string *)local_348,(string *)&local_508);
          ::std::__cxx11::string::~string((string *)&local_508);
          ::std::__cxx11::string::~string((string *)local_528);
          SPIRType::~SPIRType((SPIRType *)local_4d8);
        }
      }
      if (local_11c == 0) {
        statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[26],std::__cxx11::string&>
                  (this,(char (*) [8])"layout(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   (char (*) [26])0x67abac,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      }
      else {
        statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[44],unsigned_int&,char_const(&)[10],std::__cxx11::string&>
                  (this,(char (*) [8])"layout(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   (char (*) [44])"buffer_reference, buffer_reference_align = ",&local_11c,
                   (char (*) [10])0x67abbc,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      }
      ::std::__cxx11::string::~string((string *)local_348);
    }
    begin_scope(this);
    bVar2 = Compiler::is_physical_pointer_to_buffer_block
                      (&this->super_Compiler,(SPIRType *)buffer_name.field_2._8_8_);
    if (bVar2) {
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(buffer_name.field_2._8_8_ + 0x118));
      __range3._4_4_ = 0;
      __begin3 = (TypedID<(spirv_cross::Types)1> *)(buffer_name.field_2._8_8_ + 0x88);
      __end3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin3);
      member = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin3);
      for (; __end3 != member; __end3 = __end3 + 1) {
        local_550 = (TypedID *)__end3;
        add_member_name(this,(SPIRType *)buffer_name.field_2._8_8_,__range3._4_4_);
        uVar7 = buffer_name.field_2._8_8_;
        uVar4 = TypedID::operator_cast_to_unsigned_int(local_550);
        uVar1 = __range3._4_4_;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_570,"",(allocator *)((long)&pointee_type + 7));
        (*(this->super_Compiler)._vptr_Compiler[0x15])
                  (this,uVar7,(ulong)uVar4,(ulong)uVar1,local_570,0);
        ::std::__cxx11::string::~string(local_570);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&pointee_type + 7));
        __range3._4_4_ = __range3._4_4_ + 1;
      }
    }
    else {
      local_580 = Compiler::get_pointee_type
                            (&this->super_Compiler,(SPIRType *)buffer_name.field_2._8_8_);
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_5a0,this,local_580,0);
      (*(this->super_Compiler)._vptr_Compiler[0x26])(&local_5c0,this,local_580,0);
      statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                (this,&local_5a0,(char (*) [7])0x64cfd8,&local_5c0,(char (*) [2])0x6815db);
      ::std::__cxx11::string::~string((string *)&local_5c0);
      ::std::__cxx11::string::~string((string *)&local_5a0);
    }
    end_scope_decl(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x65adc5);
  }
  else {
    statement<char_const(&)[33],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [33])"layout(buffer_reference) buffer ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [2])0x6815db);
  }
  ::std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_reference_block(uint32_t type_id, bool forward_declaration)
{
	auto &type = get<SPIRType>(type_id);
	string buffer_name;

	if (forward_declaration && is_physical_pointer_to_buffer_block(type))
	{
		// Block names should never alias, but from HLSL input they kind of can because block types are reused for UAVs ...
		// Allow aliased name since we might be declaring the block twice. Once with buffer reference (forward declared) and one proper declaration.
		// The names must match up.
		buffer_name = to_name(type.self, false);

		// Shaders never use the block by interface name, so we don't
		// have to track this other than updating name caches.
		// If we have a collision for any reason, just fallback immediately.
		if (ir.meta[type.self].decoration.alias.empty() ||
		    block_ssbo_names.find(buffer_name) != end(block_ssbo_names) ||
		    resource_names.find(buffer_name) != end(resource_names))
		{
			buffer_name = join("_", type.self);
		}

		// Make sure we get something unique for both global name scope and block name scope.
		// See GLSL 4.5 spec: section 4.3.9 for details.
		add_variable(block_ssbo_names, resource_names, buffer_name);

		// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
		// This cannot conflict with anything else, so we're safe now.
		// We cannot reuse this fallback name in neither global scope (blocked by block_names) nor block name scope.
		if (buffer_name.empty())
			buffer_name = join("_", type.self);

		block_names.insert(buffer_name);
		block_ssbo_names.insert(buffer_name);

		// Ensure we emit the correct name when emitting non-forward pointer type.
		ir.meta[type.self].decoration.alias = buffer_name;
	}
	else
	{
		buffer_name = type_to_glsl(type);
	}

	if (!forward_declaration)
	{
		auto itr = physical_storage_type_to_alignment.find(type_id);
		uint32_t alignment = 0;
		if (itr != physical_storage_type_to_alignment.end())
			alignment = itr->second.alignment;

		if (is_physical_pointer_to_buffer_block(type))
		{
			SmallVector<std::string> attributes;
			attributes.push_back("buffer_reference");
			if (alignment)
				attributes.push_back(join("buffer_reference_align = ", alignment));
			attributes.push_back(buffer_to_packing_standard(type, true, true));

			auto flags = ir.get_buffer_block_type_flags(type);
			string decorations;
			if (flags.get(DecorationRestrict))
				decorations += " restrict";
			if (flags.get(DecorationCoherent))
				decorations += " coherent";
			if (flags.get(DecorationNonReadable))
				decorations += " writeonly";
			if (flags.get(DecorationNonWritable))
				decorations += " readonly";

			statement("layout(", merge(attributes), ")", decorations, " buffer ", buffer_name);
		}
		else
		{
			string packing_standard;
			if (type.basetype == SPIRType::Struct)
			{
				// The non-block type is embedded in a block, so we cannot use enhanced layouts :(
				packing_standard = buffer_to_packing_standard(type, true, false) + ", ";
			}
			else if (is_array(get_pointee_type(type)))
			{
				SPIRType wrap_type{OpTypeStruct};
				wrap_type.self = ir.increase_bound_by(1);
				wrap_type.member_types.push_back(get_pointee_type_id(type_id));
				ir.set_member_decoration(wrap_type.self, 0, DecorationOffset, 0);
				packing_standard = buffer_to_packing_standard(wrap_type, true, false) + ", ";
			}

			if (alignment)
				statement("layout(", packing_standard, "buffer_reference, buffer_reference_align = ", alignment, ") buffer ", buffer_name);
			else
				statement("layout(", packing_standard, "buffer_reference) buffer ", buffer_name);
		}

		begin_scope();

		if (is_physical_pointer_to_buffer_block(type))
		{
			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}
		}
		else
		{
			auto &pointee_type = get_pointee_type(type);
			statement(type_to_glsl(pointee_type), " value", type_to_array_glsl(pointee_type, 0), ";");
		}

		end_scope_decl();
		statement("");
	}
	else
	{
		statement("layout(buffer_reference) buffer ", buffer_name, ";");
	}
}